

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

global_object_create_result *
mjs::anon_unknown_35::make_console_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  slot *psVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  gc_heap_ptr_untyped gStack_f8;
  undefined1 local_e8 [16];
  gc_heap_ptr_untyped local_d8;
  gc_heap_ptr_untyped local_c8;
  undefined1 local_b8 [16];
  slot *local_a8;
  string_view local_a0;
  object_ptr console;
  value local_80;
  string_view local_58;
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>
  timers;
  
  psVar1 = (slot *)(global->super_gc_heap_ptr_untyped).heap_;
  gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::make_object((global_object *)&console);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_58,&global->super_gc_heap_ptr_untyped);
  local_a0._M_len = 6;
  local_a0._M_str = "assert";
  string::string((string *)&gStack_f8,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&console.super_gc_heap_ptr_untyped);
  make_raw_function((mjs *)(local_e8 + 0x10),global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_e8 + 0x10));
  local_e8._0_8_ = (gc_heap *)0x0;
  local_e8._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_b8,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b8);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c70f0;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)((long)pvVar4 + 0x10),(gc_heap_ptr_untyped *)&local_58);
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_b8,
             (gc_heap_ptr<mjs::gc_string> *)&gStack_f8,(gc_heap_ptr<mjs::gc_string> *)local_e8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_c8,(gc_heap_ptr_untyped *)(local_e8 + 0x10));
  value::value(&local_80,(object_ptr *)&local_c8);
  (**(code **)(*plVar2 + 8))(plVar2,&gStack_f8,&local_80,2);
  value::~value(&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_58);
  std::
  make_shared<std::unordered_map<std::__cxx11::wstring,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::hash<std::__cxx11::wstring>,std::equal_to<std::__cxx11::wstring>,std::allocator<std::pair<std::__cxx11::wstring_const,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>>
            ();
  local_a0._M_len = 3;
  local_a0._M_str = "log";
  string::string((string *)&gStack_f8,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&console.super_gc_heap_ptr_untyped);
  make_raw_function((mjs *)(local_e8 + 0x10),global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_e8 + 0x10));
  local_e8._0_8_ = (gc_heap *)0x0;
  local_e8._8_4_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_b8,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_b8);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c7130;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_b8,
             (gc_heap_ptr<mjs::gc_string> *)&gStack_f8,(gc_heap_ptr<mjs::gc_string> *)local_e8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_c8,(gc_heap_ptr_untyped *)(local_e8 + 0x10));
  value::value(&local_80,(object_ptr *)&local_c8);
  (**(code **)(*plVar2 + 8))(plVar2,&gStack_f8,&local_80,2);
  value::~value(&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_f8);
  std::
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_b8,
                 &timers.
                  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_58._M_len = 4;
  local_58._M_str = "time";
  local_a8 = psVar1;
  string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,&local_58);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&console.super_gc_heap_ptr_untyped);
  make_raw_function((mjs *)&gStack_f8,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&gStack_f8);
  local_c8.heap_ = (gc_heap *)0x0;
  local_c8.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_e8,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e8);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c7170;
  std::
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)((long)pvVar4 + 0x10),
                 (__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_b8);
  *(slot **)((long)pvVar4 + 0x20) = local_a8;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_e8,
             (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_c8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e8 + 0x10),&gStack_f8);
  value::value(&local_80,(object_ptr *)(local_e8 + 0x10));
  (**(code **)(*plVar2 + 8))(plVar2,&local_a0,&local_80,2);
  value::~value(&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_b8,
                 &timers.
                  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_58._M_len = 7;
  local_58._M_str = "timeEnd";
  local_a8 = psVar1;
  string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,&local_58);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&console.super_gc_heap_ptr_untyped);
  make_raw_function((mjs *)&gStack_f8,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&gStack_f8);
  local_c8.heap_ = (gc_heap *)0x0;
  local_c8.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_e8,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e8);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001c71b0;
  std::
  __shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)((long)pvVar4 + 0x10),
                 (__shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_b8);
  *(slot **)((long)pvVar4 + 0x20) = local_a8;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_e8,
             (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_c8,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e8 + 0x10),&gStack_f8);
  value::value(&local_80,(object_ptr *)(local_e8 + 0x10));
  (**(code **)(*plVar2 + 8))(plVar2,&local_a0,&local_80,2);
  value::~value(&local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)__return_storage_ptr__,&console.super_gc_heap_ptr_untyped);
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
  (__return_storage_ptr__->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&timers.
              super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&console.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_console_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto console = global->make_object();

    put_native_function(global, console, "assert", [global](const value&, const std::vector<value>& args) {
        const auto val = !args.empty() ? args.front() : value::undefined;
        if (to_boolean(val)) {
            return value::undefined;
        }
        std::wostringstream woss;
        if (args.size() > 1) {
            auto&h = global.heap();
            for (size_t i = 1; i < args.size(); ++i) {
                if (i > 1) woss << " ";
                woss << to_string(h, args[i]).view();
            }
        } else {
            debug_print(woss, val, 4);
            woss << " == true";
        }
        throw native_error_exception{native_error_type::assertion, global->stack_trace(), woss.str()};
    }, 1);

    using timer_clock = std::chrono::steady_clock;

    auto timers = std::make_shared<std::unordered_map<std::wstring, timer_clock::time_point>>();
    put_native_function(global, console, "log", [](const value&, const std::vector<value>& args) {
        for (const auto& a: args) {
            if (a.type() == value_type::string) {
                std::wcout << a.string_value();
            } else {
                mjs::debug_print(std::wcout, a, 4);
            }
            std::wcout << ' ';
        }
        std::wcout << '\n';
        return value::undefined;
    }, 1);
    put_native_function(global, console, "time", [timers, &h](const value&, const std::vector<value>& args) {
        if (args.empty()) {
            THROW_RUNTIME_ERROR("Missing argument to console.time()");
        }
        auto label = to_string(h, args.front());
        (*timers)[std::wstring{label.view()}] = timer_clock::now();
        return value::undefined;
    }, 1);
    put_native_function(global, console, "timeEnd", [timers, &h](const value&, const std::vector<value>& args) {
        const auto end_time = timer_clock::now();
        if (args.empty()) {
            THROW_RUNTIME_ERROR("Missing argument to console.timeEnd()");
        }
        auto label = to_string(h, args.front());
        auto it = timers->find(std::wstring{label.view()});
        if (it == timers->end()) {
            std::wostringstream woss;
            woss << "Timer not found: " << label;
            THROW_RUNTIME_ERROR(woss.str());
        }
        std::wcout << label << ": " << show_duration(end_time - it->second) << "\n";
        timers->erase(it);
        return value::undefined;
    }, 1);

    return { console, nullptr };
}